

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fIntegerStateQueryTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::anon_unknown_2::StencilOpSeparateTestCase::SetStencilOp
          (StencilOpSeparateTestCase *this,GLenum stencilOpValue)

{
  GLenum GVar1;
  GLenum stencilOpValue_local;
  StencilOpSeparateTestCase *this_local;
  
  GVar1 = (this->super_StencilOpTestCase).m_stencilOpName;
  if (GVar1 == 0xb94) {
LAB_019f1395:
    glu::CallLogWrapper::glStencilOpSeparate
              (&(this->super_StencilOpTestCase).super_ApiCase.super_CallLogWrapper,
               *(GLenum *)&(this->super_StencilOpTestCase).field_0xa4,stencilOpValue,0x1e00,0x1e00);
  }
  else {
    if (GVar1 == 0xb95) {
LAB_019f13b9:
      glu::CallLogWrapper::glStencilOpSeparate
                (&(this->super_StencilOpTestCase).super_ApiCase.super_CallLogWrapper,
                 *(GLenum *)&(this->super_StencilOpTestCase).field_0xa4,0x1e00,stencilOpValue,0x1e00
                );
      return;
    }
    if (GVar1 != 0xb96) {
      if (GVar1 == 0x8801) goto LAB_019f1395;
      if (GVar1 == 0x8802) goto LAB_019f13b9;
      if (GVar1 != 0x8803) {
        return;
      }
    }
    glu::CallLogWrapper::glStencilOpSeparate
              (&(this->super_StencilOpTestCase).super_ApiCase.super_CallLogWrapper,
               *(GLenum *)&(this->super_StencilOpTestCase).field_0xa4,0x1e00,0x1e00,stencilOpValue);
  }
  return;
}

Assistant:

void SetStencilOp (GLenum stencilOpValue)
	{
		switch (m_stencilOpName)
		{
		case GL_STENCIL_FAIL:
		case GL_STENCIL_BACK_FAIL:
			glStencilOpSeparate(m_stencilOpFace, stencilOpValue, GL_KEEP, GL_KEEP);
			break;

		case GL_STENCIL_PASS_DEPTH_FAIL:
		case GL_STENCIL_BACK_PASS_DEPTH_FAIL:
			glStencilOpSeparate(m_stencilOpFace, GL_KEEP, stencilOpValue, GL_KEEP);
			break;

		case GL_STENCIL_PASS_DEPTH_PASS:
		case GL_STENCIL_BACK_PASS_DEPTH_PASS:
			glStencilOpSeparate(m_stencilOpFace, GL_KEEP, GL_KEEP, stencilOpValue);
			break;

		default:
			DE_ASSERT(false && "should not happen");
			break;
		}
	}